

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall
wallet::CWallet::ChangeWalletPassphrase
          (CWallet *this,SecureString *strOldWalletPassphrase,SecureString *strNewWalletPassphrase)

{
  WalletDatabase *pWVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  long lVar6;
  long lVar7;
  uint parameters;
  _Rb_tree_header *p_Var8;
  byte bVar9;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_01;
  span<const_unsigned_char,_18446744073709551615UL> salt_02;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext;
  CKeyingMaterial _vMasterKey;
  CCrypter crypter;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  WalletBatch local_b8;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_a8;
  CCrypter local_90;
  unique_lock<std::recursive_mutex> local_58;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsLocked(this);
  local_48._M_device = &(this->m_relock_mutex).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  local_58._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_58._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_58);
  Lock(this);
  CCrypter::CCrypter(&local_90);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var8) {
    bVar9 = 0;
  }
  else {
    do {
      salt._M_extent._M_extent_value = (long)p_Var5[2]._M_parent - (long)*(pointer *)(p_Var5 + 2);
      salt._M_ptr = *(pointer *)(p_Var5 + 2);
      bVar3 = CCrypter::SetKeyFromPassphrase
                        (&local_90,strOldWalletPassphrase,salt,
                         *(uint *)((long)&p_Var5[2]._M_right + 4),*(uint *)&p_Var5[2]._M_right);
      bVar9 = 1;
      if (!bVar3) goto LAB_0052951b;
      ciphertext._M_extent._M_extent_value = (long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent;
      ciphertext._M_ptr = (pointer)p_Var5[1]._M_parent;
      bVar3 = CCrypter::Decrypt(&local_90,ciphertext,(CKeyingMaterial *)&local_a8);
      if (!bVar3) goto LAB_0052951b;
      bVar3 = Unlock(this,(CKeyingMaterial *)&local_a8);
      if (bVar3) {
        lVar6 = std::chrono::_V2::steady_clock::now();
        salt_00._M_extent._M_extent_value =
             (long)p_Var5[2]._M_parent - (long)*(pointer *)(p_Var5 + 2);
        salt_00._M_ptr = *(pointer *)(p_Var5 + 2);
        CCrypter::SetKeyFromPassphrase
                  (&local_90,strNewWalletPassphrase,salt_00,*(uint *)((long)&p_Var5[2]._M_right + 4)
                   ,*(uint *)&p_Var5[2]._M_right);
        uVar4 = *(uint *)((long)&p_Var5[2]._M_right + 4);
        lVar7 = std::chrono::_V2::steady_clock::now();
        *(int *)((long)&p_Var5[2]._M_right + 4) =
             (int)(long)(((double)uVar4 * 100.0 * 1000000.0) / (double)(lVar7 - lVar6));
        lVar6 = std::chrono::_V2::steady_clock::now();
        salt_01._M_extent._M_extent_value =
             (long)p_Var5[2]._M_parent - (long)*(pointer *)(p_Var5 + 2);
        salt_01._M_ptr = *(pointer *)(p_Var5 + 2);
        CCrypter::SetKeyFromPassphrase
                  (&local_90,strNewWalletPassphrase,salt_01,*(uint *)((long)&p_Var5[2]._M_right + 4)
                   ,*(uint *)&p_Var5[2]._M_right);
        uVar4 = *(uint *)((long)&p_Var5[2]._M_right + 4);
        lVar7 = std::chrono::_V2::steady_clock::now();
        uVar4 = (int)(long)(((double)uVar4 * 100.0 * 1000000.0) / (double)(lVar7 - lVar6)) + uVar4;
        parameters = 25000;
        if (49999 < uVar4) {
          parameters = uVar4 >> 1;
        }
        *(uint *)((long)&p_Var5[2]._M_right + 4) = parameters;
        WalletLogPrintf<unsigned_int>
                  (this,"Wallet passphrase changed to an nDeriveIterations of %i\n",parameters);
        salt_02._M_extent._M_extent_value =
             (long)p_Var5[2]._M_parent - (long)*(pointer *)(p_Var5 + 2);
        salt_02._M_ptr = *(pointer *)(p_Var5 + 2);
        bVar3 = CCrypter::SetKeyFromPassphrase
                          (&local_90,strNewWalletPassphrase,salt_02,
                           *(uint *)((long)&p_Var5[2]._M_right + 4),*(uint *)&p_Var5[2]._M_right);
        if (!bVar3) goto LAB_0052951b;
        bVar3 = CCrypter::Encrypt(&local_90,(CKeyingMaterial *)&local_a8,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &p_Var5[1]._M_parent);
        if (!bVar3) goto LAB_0052951b;
        pWVar1 = (this->m_database)._M_t.
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
        if (pWVar1 == (WalletDatabase *)0x0) {
          __assert_fail("static_cast<bool>(m_database)",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                        ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
        }
        (*pWVar1->_vptr_WalletDatabase[0xe])(&local_b8,pWVar1,1);
        local_b8.m_database = pWVar1;
        WalletBatch::WriteMasterKey(&local_b8,p_Var5[1]._M_color,(CMasterKey *)&p_Var5[1]._M_parent)
        ;
        if ((_Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
            local_b8.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
            (DatabaseBatch *)0x0) {
          (*(*(_func_int ***)
              local_b8.m_batch._M_t.
              super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
              .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
        }
        bVar9 = 1;
        if (bVar2) {
          Lock(this);
          p_Var8 = (_Rb_tree_header *)0x1;
        }
        else {
          p_Var8 = (_Rb_tree_header *)0x1;
        }
        goto LAB_0052951d;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
    bVar9 = 0;
LAB_0052951b:
    p_Var8 = (_Rb_tree_header *)0x0;
  }
LAB_0052951d:
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  CCrypter::~CCrypter(&local_90);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar9 & (byte)p_Var8);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ChangeWalletPassphrase(const SecureString& strOldWalletPassphrase, const SecureString& strNewWalletPassphrase)
{
    bool fWasLocked = IsLocked();

    {
        LOCK2(m_relock_mutex, cs_wallet);
        Lock();

        CCrypter crypter;
        CKeyingMaterial _vMasterKey;
        for (MasterKeyMap::value_type& pMasterKey : mapMasterKeys)
        {
            if(!crypter.SetKeyFromPassphrase(strOldWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                return false;
            if (!crypter.Decrypt(pMasterKey.second.vchCryptedKey, _vMasterKey))
                return false;
            if (Unlock(_vMasterKey))
            {
                constexpr MillisecondsDouble target{100};
                auto start{SteadyClock::now()};
                crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod);
                pMasterKey.second.nDeriveIterations = static_cast<unsigned int>(pMasterKey.second.nDeriveIterations * target / (SteadyClock::now() - start));

                start = SteadyClock::now();
                crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod);
                pMasterKey.second.nDeriveIterations = (pMasterKey.second.nDeriveIterations + static_cast<unsigned int>(pMasterKey.second.nDeriveIterations * target / (SteadyClock::now() - start))) / 2;

                if (pMasterKey.second.nDeriveIterations < 25000)
                    pMasterKey.second.nDeriveIterations = 25000;

                WalletLogPrintf("Wallet passphrase changed to an nDeriveIterations of %i\n", pMasterKey.second.nDeriveIterations);

                if (!crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                    return false;
                if (!crypter.Encrypt(_vMasterKey, pMasterKey.second.vchCryptedKey))
                    return false;
                WalletBatch(GetDatabase()).WriteMasterKey(pMasterKey.first, pMasterKey.second);
                if (fWasLocked)
                    Lock();
                return true;
            }
        }
    }

    return false;
}